

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

uint64_t flatcc_json_parser_symbol_part(char *buf,char *end)

{
  ulong uVar1;
  size_t n;
  char *end_local;
  char *buf_local;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    buf_local = (char *)flatcc_json_parser_symbol_part_ext(buf,end);
  }
  else {
    uVar1 = *(ulong *)buf;
    buf_local = (char *)(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                         (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                         (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  }
  return (uint64_t)buf_local;
}

Assistant:

static inline uint64_t flatcc_json_parser_symbol_part(const char *buf, const char *end)
{
    size_t n = (size_t)(end - buf);

#if FLATCC_ALLOW_UNALIGNED_ACCESS
    if (n >= 8) {
        return be64toh(*(uint64_t *)buf);
    }
#endif
    return flatcc_json_parser_symbol_part_ext(buf, end);
}